

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O2

Cnf_Cut_t * Cnf_CutAlloc(Cnf_Man_t *p,int nLeaves)

{
  Cnf_Cut_t *pCVar1;
  int iVar2;
  
  iVar2 = 1 << ((char)nLeaves - 5U & 0x1f);
  if (nLeaves < 6) {
    iVar2 = 1;
  }
  pCVar1 = (Cnf_Cut_t *)Aig_MmFlexEntryFetch(p->pMemCuts,(nLeaves + iVar2) * 4 + 0x18);
  pCVar1->nFanins = (char)nLeaves;
  pCVar1->nWords = (short)iVar2;
  pCVar1->vIsop[0] = (Vec_Int_t *)0x0;
  pCVar1->vIsop[1] = (Vec_Int_t *)0x0;
  return pCVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates cut of the given size.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cnf_Cut_t * Cnf_CutAlloc( Cnf_Man_t * p, int nLeaves )
{
    Cnf_Cut_t * pCut;
    int nSize = sizeof(Cnf_Cut_t) + sizeof(int) * nLeaves + sizeof(unsigned) * Abc_TruthWordNum(nLeaves);
    pCut = (Cnf_Cut_t *)Aig_MmFlexEntryFetch( p->pMemCuts, nSize );
    pCut->nFanins = nLeaves;
    pCut->nWords = Abc_TruthWordNum(nLeaves);
    pCut->vIsop[0] = pCut->vIsop[1] = NULL;
    return pCut;
}